

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O2

int __thiscall gmath::SturmChain<double>::countSignChangesPosInf(SturmChain<double> *this)

{
  double dVar1;
  Polynomial<double> *pPVar2;
  int iVar3;
  double **ppdVar4;
  long lVar5;
  double dVar6;
  
  pPVar2 = this->f;
  ppdVar4 = &pPVar2[1].c;
  iVar3 = 0;
  dVar6 = pPVar2->c[(long)pPVar2->used + -1];
  for (lVar5 = 1; lVar5 < this->n; lVar5 = lVar5 + 1) {
    dVar1 = (*ppdVar4)[(long)*(int *)((long)ppdVar4 + -4) + -1];
    if (((dVar6 < 0.0) && (0.0 <= dVar1)) || ((0.0 <= dVar6 && (dVar1 < 0.0)))) {
      iVar3 = iVar3 + 1;
    }
    ppdVar4 = ppdVar4 + 2;
    dVar6 = dVar1;
  }
  return iVar3;
}

Assistant:

int countSignChangesPosInf() const
    {
      double f1;
      int    ret=0;

      // the sign of the highest coefficient has the same sign as the
      // limes at positive infinity

      f1=f[0][f[0].getDegree()];

      for (int k=1; k<n; k++)
      {
        double f2=f[k][f[k].getDegree()];

        if ((f1 < 0 && f2 >= 0) || (f1 >= 0 && f2 < 0))
        {
          ret++;
        }

        f1=f2;
      }

      return ret;
    }